

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_TakeStepMRISR(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  undefined8 *in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem_00;
  undefined8 uVar4;
  sunrealtype tol;
  int max_stages;
  int nvec;
  int nested_mri;
  int need_inner_dsm;
  sunrealtype cstage;
  int impl_corr;
  int solution;
  int embedding;
  SUNAdaptController_Type adapt_type;
  N_Vector ytemp;
  N_Vector ytilde;
  int retval;
  int j;
  int stage;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  N_Vector in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ARKodeMRIStepMem in_stack_ffffffffffffff40;
  ARKodeMem in_stack_ffffffffffffff48;
  sunrealtype in_stack_ffffffffffffff50;
  ARKodeMRIStepMem step_mem_00;
  ARKodeMem in_stack_ffffffffffffff58;
  N_Vector in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint uVar5;
  ARKodeMem ark_mem_01;
  int iVar6;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar7;
  ARKodeMem ark_mem_02;
  int local_6c;
  uint local_68;
  int local_64;
  ARKodeMem local_60;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_4c;
  N_Vector local_48;
  N_Vector local_40;
  int local_34;
  int local_30;
  int local_2c;
  ARKodeMRIStepMem local_28;
  int *local_20;
  undefined8 *local_18;
  ARKodeMem local_10;
  
  ark_mem_02 = (ARKodeMem)&DAT_3d19000000000000;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = mriStep_AccessStepMem
                       ((ARKodeMem)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (char *)in_stack_ffffffffffffff30,
                        (ARKodeMRIStepMem *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (local_34 != 0) {
    return local_34;
  }
  *local_20 = 0;
  *local_18 = 0;
  local_40 = local_10->tempv4;
  local_48 = local_10->tempv2;
  local_4c = SUNAdaptController_GetType(local_10->hadapt_mem->hcontroller);
  local_64 = 0;
  if (local_4c == 2) {
    local_64 = 1;
    local_28->inner_dsm = 0.0;
    local_34 = mriStepInnerStepper_ResetAccumulatedError
                         ((MRIStepInnerStepper)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (local_34 != 0) {
      arkProcessError(local_10,-0x22,0x912,"mriStep_TakeStepMRISR",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unable to reset the inner stepper error estimate");
      return -0x22;
    }
    local_34 = mriStepInnerStepper_SetRTol
                         ((MRIStepInnerStepper)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          7.98787549832877e-318);
    if (local_34 != 0) {
      arkProcessError(local_10,-0x22,0x91b,"mriStep_TakeStepMRISR",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unable to set the inner stepper tolerance");
      return -0x22;
    }
    local_34 = 0;
  }
  if (local_10->fixedstep == 0) {
    local_34 = mriStepInnerStepper_Reset
                         ((MRIStepInnerStepper)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          (sunrealtype)in_stack_ffffffffffffff30,
                          (N_Vector)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (local_34 != 0) {
      arkProcessError(local_10,-0x22,0x928,"mriStep_TakeStepMRISR",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unable to reset the inner stepper");
      return -0x22;
    }
    local_34 = 0;
  }
  uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffff84);
  if (local_28->expforcing == 0) {
    uVar7 = CONCAT13(local_28->impforcing != 0,(int3)in_stack_ffffffffffffff84);
  }
  local_68 = uVar7 >> 0x18;
  if ((local_10->fn == (N_Vector)0x0) || (local_68 != 0)) {
    local_34 = mriStep_UpdateF0(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                (sunrealtype)
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    if (local_34 != 0) {
      return -8;
    }
    if (((local_10->fn != (N_Vector)0x0) && (local_68 != 0)) && (local_28->implicit_rhs != 0)) {
      if ((local_28->implicit_rhs == 0) || (local_28->explicit_rhs == 0)) {
        N_VScale(0x3ff0000000000000,*local_28->Fsi,local_10->fn);
      }
      else {
        N_VLinearSum(*local_28->Fsi,*local_28->Fse,local_10->fn);
      }
    }
  }
  if ((local_10->fn != (N_Vector)0x0) && (local_10->fn_is_current == 0)) {
    iVar1 = mriStep_FullRHS(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                            (N_Vector)in_stack_ffffffffffffff48,(N_Vector)in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff3c);
    if (iVar1 != 0) {
      return -8;
    }
    local_34 = 0;
  }
  local_10->fn_is_current = 1;
  if ((local_28->implicit_rhs != 0) && (local_28->explicit_rhs != 0)) {
    N_VLinearSum(*local_28->Fse,*local_28->Fsi,*local_28->Fse);
  }
  if ((local_10->fixedstep == 0) || (local_10->AccumErrorType != ARK_ACCUMERROR_NONE)) {
    iVar1 = local_28->stages + 1;
  }
  else {
    iVar1 = local_28->stages;
  }
  local_2c = 1;
  iVar6 = iVar1;
  do {
    if (iVar1 <= local_2c) {
      if ((local_10->fixedstep == 0) || (local_10->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        N_VLinearSum(0x3ff0000000000000,0,local_40,local_10->ycur,local_10->tempv1);
        uVar4 = N_VWrmsNorm(local_10->tempv1,local_10->ewt);
        *local_18 = uVar4;
        N_VScale(0x3ff0000000000000,local_40,local_10->ycur);
      }
      return 0;
    }
    local_54 = (uint)(local_2c == local_28->stages + -1);
    local_50 = (uint)(local_2c == local_28->stages);
    N_VScale(0x3ff0000000000000,local_10->yn,local_10->ycur);
    if (local_50 == 0) {
      ark_mem_01 = (ARKodeMem)local_28->MRIC->c[local_2c];
    }
    else {
      ark_mem_01 = (ARKodeMem)&DAT_3ff0000000000000;
    }
    local_60 = ark_mem_01;
    local_34 = mriStep_ComputeInnerForcing
                         (ark_mem_02,(ARKodeMRIStepMem)CONCAT44(uVar7,iVar6),
                          (int)((ulong)ark_mem_01 >> 0x20),
                          (sunrealtype)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                          ,(sunrealtype)in_stack_ffffffffffffff68);
    if (local_34 != 0) {
      return local_34;
    }
    uVar5 = in_stack_ffffffffffffff74;
    if ((1 < local_2c) &&
       (local_34 = mriStepInnerStepper_Reset
                             ((MRIStepInnerStepper)
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              (sunrealtype)in_stack_ffffffffffffff30,
                              (N_Vector)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
       uVar5 = in_stack_ffffffffffffff74, local_34 != 0)) {
      arkProcessError(local_10,-0x22,0x999,"mriStep_TakeStepMRISR",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unable to reset the inner stepper");
      return -0x22;
    }
    local_34 = 0;
    step_mem_00 = (ARKodeMRIStepMem)local_10->tn;
    ark_mem_00 = (ARKodeMem)((double)local_60 * local_10->h + local_10->tn);
    in_stack_ffffffffffffff74 = uVar5 & 0xffffff;
    if (local_64 != 0) {
      in_stack_ffffffffffffff74 = CONCAT13(local_50 != 0,(int3)uVar5) ^ 0xff000000;
    }
    in_stack_ffffffffffffff68 = local_48;
    local_34 = mriStep_StageERKFast
                         (ark_mem_00,step_mem_00,(sunrealtype)local_28,(sunrealtype)local_10,
                          (N_Vector)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    iVar3 = (int)((ulong)step_mem_00 >> 0x20);
    if (local_34 != 0) {
      *local_20 = 4;
      return local_34;
    }
    local_10->tcur = (double)local_60 * local_10->h + local_10->tn;
    local_58 = 0;
    iVar2 = 0;
    if (local_28->implicit_rhs != 0) {
      local_58 = (uint)(2.220446049250313e-14 < ABS((*local_28->MRIC->G)[local_2c][local_2c]));
      if (local_58 == 0) {
        *local_28->cvals = 1.0;
        *local_28->Xvecs = local_10->ycur;
        for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
          local_28->cvals[local_30 + 1] = local_10->h * (*local_28->MRIC->G)[local_2c][local_30];
          local_28->Xvecs[local_30 + 1] = local_28->Fsi[local_30];
        }
        iVar3 = N_VLinearCombination(local_2c + 1,local_28->cvals,local_28->Xvecs,local_10->ycur);
        if (iVar3 != 0) {
          return -0x1c;
        }
        iVar2 = 0;
      }
      else {
        in_stack_ffffffffffffff3c = local_2c;
        if (local_2c == local_28->stages) {
          in_stack_ffffffffffffff3c = local_2c + -1;
        }
        local_28->istage = in_stack_ffffffffffffff3c;
        local_34 = mriStep_Predict(ark_mem_01,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
        if (local_34 != 0) {
          return local_34;
        }
        iVar2 = 0;
        if (local_28->stage_predict != (ARKStagePredictFn)0x0) {
          iVar2 = (*local_28->stage_predict)(local_10->tcur,local_28->zpred,local_10->user_data);
          if (iVar2 < 0) {
            return -0x27;
          }
          if (0 < iVar2) {
            return 5;
          }
        }
        local_34 = iVar2;
        *local_28->cvals = 1.0;
        *local_28->Xvecs = local_10->ycur;
        local_28->cvals[1] = -1.0;
        local_28->Xvecs[1] = local_28->zpred;
        for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
          local_28->cvals[local_30 + 2] = local_10->h * (*local_28->MRIC->G)[local_2c][local_30];
          local_28->Xvecs[local_30 + 2] = local_28->Fsi[local_30];
        }
        local_34 = N_VLinearCombination
                             (local_2c + 2,local_28->cvals,local_28->Xvecs,local_28->sdata);
        if (local_34 != 0) {
          return -0x1c;
        }
        local_28->gamma = local_10->h * (*local_28->MRIC->G)[local_2c][local_2c];
        if (local_10->firststage != 0) {
          local_28->gammap = local_28->gamma;
        }
        if (local_10->firststage == 0) {
          in_stack_ffffffffffffff30 = (N_Vector)(local_28->gamma / local_28->gammap);
        }
        else {
          in_stack_ffffffffffffff30 = (N_Vector)&DAT_3ff0000000000000;
        }
        local_28->gamrat = (sunrealtype)in_stack_ffffffffffffff30;
        iVar3 = mriStep_Nls(ark_mem_00,iVar3);
        *local_20 = iVar3;
        iVar2 = local_34;
        if (*local_20 != 0) {
          return 5;
        }
      }
    }
    local_34 = iVar2;
    if (local_10->ProcessStage != (ARKPostProcessFn)0x0) {
      local_34 = (*local_10->ProcessStage)(local_10->tcur,local_10->ycur,local_10->user_data);
      if (local_34 != 0) {
        return -0x26;
      }
      local_34 = mriStepInnerStepper_Reset
                           ((MRIStepInnerStepper)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            (sunrealtype)in_stack_ffffffffffffff30,
                            (N_Vector)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
      ;
      if (local_34 != 0) {
        arkProcessError(local_10,-0x22,0xa28,"mriStep_TakeStepMRISR",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Unable to reset the inner stepper");
        return -0x22;
      }
      local_34 = 0;
    }
    if ((local_54 == 0) && (local_50 == 0)) {
      if (local_28->explicit_rhs != 0) {
        local_34 = (*local_28->fse)(local_10->tcur,local_10->ycur,local_28->Fse[local_2c],
                                    local_10->user_data);
        local_28->nfse = local_28->nfse + 1;
        if (local_34 < 0) {
          return -8;
        }
        if (0 < local_34) {
          return -0xb;
        }
        if (local_28->expforcing != 0) {
          *local_28->cvals = 1.0;
          *local_28->Xvecs = local_28->Fse[local_2c];
          local_6c = 1;
          mriStep_ApplyForcing(local_28,local_10->tcur,1.0,&local_6c);
          N_VLinearCombination(local_6c,local_28->cvals,local_28->Xvecs,local_28->Fse[local_2c]);
        }
      }
      if (local_28->implicit_rhs != 0) {
        if ((local_28->deduce_rhs == 0) || (local_58 == 0)) {
          local_34 = (*local_28->fsi)(local_10->tcur,local_10->ycur,local_28->Fsi[local_2c],
                                      local_10->user_data);
          local_28->nfsi = local_28->nfsi + 1;
          if (local_34 < 0) {
            return -8;
          }
          if (0 < local_34) {
            return -0xb;
          }
          if (local_28->impforcing != 0) {
            *local_28->cvals = 1.0;
            *local_28->Xvecs = local_28->Fsi[local_2c];
            local_6c = 1;
            mriStep_ApplyForcing(local_28,local_10->tcur,1.0,&local_6c);
            N_VLinearCombination(local_6c,local_28->cvals,local_28->Xvecs,local_28->Fsi[local_2c]);
          }
        }
        else {
          N_VLinearSum(1.0 / local_28->gamma,SUB84(-1.0 / local_28->gamma,0),local_28->zcor,
                       local_28->sdata,local_28->Fsi[local_2c]);
        }
      }
      if ((local_28->implicit_rhs != 0) && (local_28->explicit_rhs != 0)) {
        N_VLinearSum(local_28->Fse[local_2c],local_28->Fsi[local_2c],local_28->Fse[local_2c]);
      }
    }
    if (local_54 != 0) {
      N_VScale(0x3ff0000000000000,local_10->ycur,local_40);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int mriStep_TakeStepMRISR(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeMRIStepMem step_mem;          /* outer stepper memory       */
  int stage, j;                       /* stage indices              */
  int retval;                         /* reusable return flag       */
  N_Vector ytilde;                    /* embedded solution          */
  N_Vector ytemp;                     /* temporary vector           */
  SUNAdaptController_Type adapt_type; /* timestep adaptivity type   */
  sunbooleantype embedding;           /* flag indicating embedding  */
  sunbooleantype solution;            /*   or solution stages       */
  sunbooleantype impl_corr;           /* is slow correct. implicit? */
  sunrealtype cstage;                 /* current stage abscissa     */
  sunbooleantype need_inner_dsm;
  sunbooleantype nested_mri;
  int nvec, max_stages;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* set N_Vector shortcuts */
  ytilde = ark_mem->tempv4;
  ytemp  = ark_mem->tempv2;

  /* if MRI adaptivity is enabled: reset fast accumulated error,
     and send appropriate control parameter to the fast integrator */
  adapt_type     = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  need_inner_dsm = SUNFALSE;
  if (adapt_type == SUN_ADAPTCONTROLLER_MRI_H_TOL)
  {
    need_inner_dsm      = SUNTRUE;
    step_mem->inner_dsm = ZERO;
    retval = mriStepInnerStepper_ResetAccumulatedError(step_mem->stepper);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper error estimate");
      return (ARK_INNERSTEP_FAIL);
    }
    retval = mriStepInnerStepper_SetRTol(step_mem->stepper,
                                         step_mem->inner_rtol_factor *
                                           ark_mem->reltol);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to set the inner stepper tolerance");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  /* for adaptive computations, reset the inner integrator to the beginning of this step */
  if (!ark_mem->fixedstep)
  {
    retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                       ark_mem->yn);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  SUNLogInfo(ARK_LOGGER, "begin-stage",
             "stage = 0, stage type = %d, tcur = " SUN_FORMAT_G, MRISTAGE_FIRST,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur, "z_0(:) =");

  /* Evaluate the slow RHS functions if needed. NOTE: we decide between calling the
     full RHS function (if ark_mem->fn is non-NULL and MRIStep is not an inner
     integrator) versus just updating the stored values of Fse[0] and Fsi[0].  In
     either case, we use ARK_FULLRHS_START mode because MRISR methods do not
     evaluate the RHS functions at the end of the time step (so nothing can be
     leveraged). */
  nested_mri = step_mem->expforcing || step_mem->impforcing;
  if (ark_mem->fn == NULL || nested_mri)
  {
    retval = mriStep_UpdateF0(ark_mem, step_mem, ark_mem->tn, ark_mem->yn,
                              ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed update F0 eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* For a nested MRI configuration we might still need fn to create a predictor
       but it should be fn only for the current nesting level which is why we use
       UpdateF0 in this case rather than FullRHS */
    if (ark_mem->fn != NULL && nested_mri && step_mem->implicit_rhs)
    {
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, step_mem->Fse[0], ark_mem->fn);
      }
      else { N_VScale(ONE, step_mem->Fsi[0], ark_mem->fn); }
    }
  }
  if (ark_mem->fn != NULL && !ark_mem->fn_is_current)
  {
    retval = mriStep_FullRHS(ark_mem, ark_mem->tn, ark_mem->yn, ark_mem->fn,
                             ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed full rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }
  }
  ark_mem->fn_is_current = SUNTRUE;

  SUNLogExtraDebugVecIf(step_mem->explicit_rhs, ARK_LOGGER, "slow explicit RHS",
                        step_mem->Fse[0], "Fse_0(:) =");
  SUNLogExtraDebugVecIf(step_mem->implicit_rhs, ARK_LOGGER, "slow implicit RHS",
                        step_mem->Fsi[0], "Fsi_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  /* combine both RHS into FSE for ImEx problems, since MRISR fast forcing function
     only depends on Omega coefficients  */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    N_VLinearSum(ONE, step_mem->Fse[0], ONE, step_mem->Fsi[0], step_mem->Fse[0]);
  }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Determine how many stages will be needed */
  max_stages = (ark_mem->fixedstep &&
                (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE))
                 ? step_mem->stages
                 : step_mem->stages + 1;

  /* Loop over stages */
  for (stage = 1; stage < max_stages; stage++)
  {
    /* Determine if this is an "embedding" or "solution" stage */
    solution  = (stage == step_mem->stages - 1);
    embedding = (stage == step_mem->stages);

    /* Set initial condition for this stage */
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

    /* Set current stage abscissa */
    cstage = (embedding) ? ONE : step_mem->MRIC->c[stage];

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, stage type = %d, tcur = " SUN_FORMAT_G, stage,
               MRISTAGE_ERK_FAST, ark_mem->tn + cstage * ark_mem->h);

    /* Compute forcing function for inner solver */
    retval = mriStep_ComputeInnerForcing(ark_mem, step_mem, stage, ark_mem->tn,
                                         ark_mem->tn + cstage * ark_mem->h);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed forcing computation, retval = %i", retval);
      return retval;
    }

    /* Reset the inner stepper on all but the first stage due to
       "stage-restart" structure */
    if (stage > 1)
    {
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Evolve fast IVP for this stage, potentially get inner dsm on
       all non-embedding stages */
    retval = mriStep_StageERKFast(ark_mem, step_mem, ark_mem->tn,
                                  ark_mem->tn + cstage * ark_mem->h,
                                  ark_mem->ycur, ytemp,
                                  need_inner_dsm && !embedding);
    if (retval != ARK_SUCCESS)
    {
      *nflagPtr = CONV_FAIL;
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed fast ERK stage, retval = %i", retval);
      return retval;
    }

    /* set current stage time for implicit correction, postprocessing
       and RHS calls */
    ark_mem->tcur = ark_mem->tn + cstage * ark_mem->h;

    /* perform MRISR slow/implicit correction */
    impl_corr = SUNFALSE;
    if (step_mem->implicit_rhs)
    {
      /* determine whether implicit RHS correction will require an implicit solve */
      impl_corr = SUNRabs(step_mem->MRIC->G[0][stage][stage]) > tol;

      /* perform implicit solve for correction */
      if (impl_corr)
      {
        /* store current stage index (for an "embedded" stage, subtract 1) */
        step_mem->istage = (stage == step_mem->stages) ? stage - 1 : stage;

        /* Call predictor for current stage solution (result placed in zpred) */
        retval = mriStep_Predict(ark_mem, step_mem->istage, step_mem->zpred);
        if (retval != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
          return (retval);
        }

        /* If a user-supplied predictor routine is provided, call that here
           Note that mriStep_Predict is *still* called, so this user-supplied
           routine can just "clean up" the built-in prediction, if desired. */
        if (step_mem->stage_predict)
        {
          retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                           ark_mem->user_data);

          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed predict, retval = %i", retval);
          if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
          if (retval > 0) { return (TRY_AGAIN); }
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred,
                            "zpred(:) =");

        /* fill sdata with explicit contributions to correction */
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        step_mem->cvals[1] = -ONE;
        step_mem->Xvecs[1] = step_mem->zpred;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 2] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 2] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 2, step_mem->cvals,
                                      step_mem->Xvecs, step_mem->sdata);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata,
                            "sdata(:) =");

        /* Update gamma for implicit solver */
        step_mem->gamma = ark_mem->h * step_mem->MRIC->G[0][stage][stage];
        if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
        step_mem->gamrat =
          (ark_mem->firststage) ? ONE : step_mem->gamma / step_mem->gammap;

        /* perform implicit solve (result is stored in ark_mem->ycur); return
           with positive value on anything but success */
        *nflagPtr = mriStep_Nls(ark_mem, *nflagPtr);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      /* perform explicit update for correction */
      else
      {
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 1] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 1] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 1, step_mem->cvals,
                                      step_mem->Xvecs, ark_mem->ycur);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }
      }
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur,
                        "z_%i(:) =", stage);

    /* apply user-supplied stage postprocessing function (if supplied),
       and reset the inner integrator with the modified stage solution */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tcur,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Compute updated slow RHS (except for final solution or embedding) */
    if ((!solution) && (!embedding))
    {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs)
      {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[stage], ark_mem->user_data);
        step_mem->nfse++;

        SUNLogExtraDebugVec(ARK_LOGGER, "slow explicit RHS",
                            step_mem->Fse[stage], "Fse_%i(:) =", stage);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed explicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

        /* Add external forcing to Fse[stage], if applicable */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[stage];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[stage]);
        }
      }

      /* store implicit slow rhs */
      if (step_mem->implicit_rhs)
      {
        if (!step_mem->deduce_rhs || !impl_corr)
        {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[stage], ark_mem->user_data);
          step_mem->nfsi++;

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed implicit rhs eval, retval = %i", retval);

          if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
          if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

          /* Add external forcing to Fsi[stage], if applicable */
          if (step_mem->impforcing)
          {
            step_mem->cvals[0] = ONE;
            step_mem->Xvecs[0] = step_mem->Fsi[stage];
            nvec               = 1;
            mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
            N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                                 step_mem->Fsi[stage]);
          }
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[stage]);

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
        }
      }

      /* combine both RHS into Fse for ImEx problems since
         fast forcing function only depends on Omega coefficients */
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fse[stage], ONE, step_mem->Fsi[stage],
                     step_mem->Fse[stage]);
      }
    }

    /* If this is the solution stage, archive for error estimation */
    if (solution) { N_VScale(ONE, ark_mem->ycur, ytilde); }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  /* if temporal error estimation is enabled: compute estimate via difference between
     step solution and embedding, store in ark_mem->tempv1, store norm in dsmPtr, and
     copy solution back to ycur */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    N_VLinearSum(ONE, ytilde, -ONE, ark_mem->ycur, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
    N_VScale(ONE, ytilde, ark_mem->ycur);
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return (ARK_SUCCESS);
}